

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuBar.cpp
# Opt level: O1

void __thiscall gui::MenuBarStyle::MenuBarStyle(MenuBarStyle *this,Gui *gui)

{
  Vector2f local_30;
  
  Style::Style(&this->super_Style,gui);
  (this->super_Style)._vptr_Style = (_func_int **)&PTR__MenuBarStyle_001e76f0;
  local_30.x = 0.0;
  local_30.y = 0.0;
  sf::RectangleShape::RectangleShape(&this->bar_,&local_30);
  local_30.x = 0.0;
  local_30.y = 0.0;
  sf::RectangleShape::RectangleShape(&this->menu_,&local_30);
  local_30.x = 0.0;
  local_30.y = 0.0;
  sf::RectangleShape::RectangleShape(&this->highlight_,&local_30);
  sf::Text::Text(&this->text_);
  sf::Color::Color(&this->textColor_);
  sf::Color::Color(&this->disabledTextColor_);
  sf::Color::Color(&this->highlightColor_);
  sf::Color::Color(&this->disabledHighlightColor_);
  (this->barTextPadding_).x = 0.0;
  (this->barTextPadding_).y = 0.0;
  *(undefined8 *)&(this->barTextPadding_).z = 0;
  (this->menuTextPadding_).y = 0.0;
  (this->menuTextPadding_).z = 0.0;
  return;
}

Assistant:

MenuBarStyle::MenuBarStyle(const Gui& gui) :
    Style(gui) {
}